

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O1

void __thiscall
GOESRImageHandler::handleImageForFalseColor(GOESRImageHandler *this,GOESRProduct *p1)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
  *this_00;
  pointer pcVar1;
  pointer pbVar2;
  __syscall_slong_t _Var3;
  undefined8 uVar4;
  int iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  long lVar8;
  long *plVar9;
  runtime_error *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  int *in_R9;
  unique_ptr<Image,_std::default_delete<Image>_> i1;
  unique_ptr<Image,_std::default_delete<Image>_> i0;
  unique_ptr<Image,_std::default_delete<Image>_> out;
  string path;
  string key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  Timer t;
  Mat mat;
  FilenameBuilder fb;
  undefined1 local_580 [16];
  undefined1 local_570 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  Timer local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [5];
  undefined1 local_468 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Alloc_hider _Stack_448;
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string asStack_3e0 [32];
  _Alloc_hider local_3c0;
  size_t local_3b8;
  string asStack_3a0 [32];
  string asStack_380 [32];
  int local_360;
  string asStack_358 [32];
  string asStack_338 [32];
  string asStack_318 [32];
  bool local_2f8;
  Mat local_2e8 [96];
  undefined1 local_288 [32];
  _Alloc_hider local_268;
  size_type local_260;
  undefined1 local_78 [8];
  char *local_70;
  undefined1 local_58 [8];
  char *local_50;
  
  Timer::Timer(&local_510);
  local_548._M_allocated_capacity = (size_type)&local_538;
  pcVar1 = (p1->region_).nameShort._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_548,pcVar1,pcVar1 + (p1->region_).nameShort._M_string_length);
  this_00 = &this->falseColor_;
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_548);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_true>
      ._M_cur == (__node_type *)0x0) {
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,(key_type *)&local_548);
    std::
    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
    _M_move_assign(&pmVar7->files_,p1);
    _Var3 = (p1->frameStart_).tv_nsec;
    (pmVar7->frameStart_).tv_sec = (p1->frameStart_).tv_sec;
    (pmVar7->frameStart_).tv_nsec = _Var3;
    std::__cxx11::string::operator=((string *)&pmVar7->product_,(string *)&p1->product_);
    std::__cxx11::string::operator=
              ((string *)&(pmVar7->product_).nameLong,(string *)&(p1->product_).nameLong);
    std::__cxx11::string::operator=((string *)&pmVar7->region_,(string *)&p1->region_);
    std::__cxx11::string::operator=
              ((string *)&(pmVar7->region_).nameLong,(string *)&(p1->region_).nameLong);
    std::__cxx11::string::operator=((string *)&pmVar7->channel_,(string *)&p1->channel_);
    std::__cxx11::string::operator=
              ((string *)&(pmVar7->channel_).nameLong,(string *)&(p1->channel_).nameLong);
    std::__cxx11::string::operator=((string *)&pmVar7->satellite_,(string *)&p1->satellite_);
    pmVar7->satelliteID_ = p1->satelliteID_;
    std::__cxx11::string::operator=((string *)&pmVar7->instrument_,(string *)&p1->instrument_);
    std::__cxx11::string::operator=((string *)&pmVar7->imagingMode_,(string *)&p1->imagingMode_);
    std::__cxx11::string::operator=((string *)&pmVar7->resolution_,(string *)&p1->resolution_);
    pmVar7->segmented_ = p1->segmented_;
    goto LAB_00181304;
  }
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)&local_548);
  GOESRProduct::GOESRProduct((GOESRProduct *)local_468,pmVar7);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(&this_00->_M_h,&local_548);
  if (local_458._8_8_ == (p1->frameStart_).tv_sec) {
    if (local_3b8 == (p1->channel_).nameShort._M_string_length) {
      if (local_3b8 != 0) {
        iVar5 = bcmp(local_3c0._M_p,(p1->channel_).nameShort._M_dataplus._M_p,local_3b8);
        if (iVar5 != 0) goto LAB_00180bf3;
      }
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,(key_type *)&local_548);
      local_288._0_8_ =
           (pmVar7->files_).
           super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_288._8_8_ =
           (pmVar7->files_).
           super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_288._16_8_ =
           (pmVar7->files_).
           super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pmVar7->files_).
      super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_468._0_8_;
      (pmVar7->files_).
      super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_468._8_8_;
      (pmVar7->files_).
      super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_458._M_allocated_capacity;
      local_468._0_8_ = (pointer)0x0;
      local_468._8_8_ = (pointer)0x0;
      local_458._M_allocated_capacity = 0;
      std::
      vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
      ::~vector((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                 *)local_288);
      (pmVar7->frameStart_).tv_sec = local_458._8_8_;
      (pmVar7->frameStart_).tv_nsec = (__syscall_slong_t)_Stack_448._M_p;
      std::__cxx11::string::operator=((string *)&pmVar7->product_,local_440);
      std::__cxx11::string::operator=((string *)&(pmVar7->product_).nameLong,local_420);
      std::__cxx11::string::operator=((string *)&pmVar7->region_,local_400);
      std::__cxx11::string::operator=((string *)&(pmVar7->region_).nameLong,asStack_3e0);
      std::__cxx11::string::operator=((string *)&pmVar7->channel_,(string *)&local_3c0);
      std::__cxx11::string::operator=((string *)&(pmVar7->channel_).nameLong,asStack_3a0);
      std::__cxx11::string::operator=((string *)&pmVar7->satellite_,asStack_380);
      pmVar7->satelliteID_ = local_360;
      std::__cxx11::string::operator=((string *)&pmVar7->instrument_,asStack_358);
      std::__cxx11::string::operator=((string *)&pmVar7->imagingMode_,asStack_338);
      std::__cxx11::string::operator=((string *)&pmVar7->resolution_,asStack_318);
      pmVar7->segmented_ = local_2f8;
    }
    else {
LAB_00180bf3:
      pbVar2 = (this->config_).channels.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_3b8 == pbVar2->_M_string_length) {
        if (local_3b8 != 0) {
          iVar5 = bcmp(local_3c0._M_p,(pbVar2->_M_dataplus)._M_p,local_3b8);
          if (iVar5 != 0) goto LAB_00180c1d;
        }
      }
      else {
LAB_00180c1d:
        std::swap<GOESRProduct>((GOESRProduct *)local_468,p1);
      }
      GOESRProduct::getFilenameBuilder
                ((FilenameBuilder *)local_288,(GOESRProduct *)local_468,&this->config_);
      local_4e8._M_allocated_capacity = (size_type)&local_4d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e8,local_268._M_p,local_268._M_p + local_260);
      util::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_528,(string *)&local_4e8,'_');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_allocated_capacity != &local_4d8) {
        operator_delete((void *)local_4e8._M_allocated_capacity,local_4d8._M_allocated_capacity + 1)
        ;
      }
      lVar8 = std::__cxx11::string::rfind((char)local_528._M_allocated_capacity + ' ',0x43);
      if (lVar8 == -1) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_570._8_4_ = 0x22e;
        util::str<char[48],char[100],char[2],int>
                  ((string *)&local_4c8,(util *)"Assertion `pos != std::string::npos` failed at ",
                   (char (*) [48])
                   "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/handler_goesr.cc"
                   ,(char (*) [100])0x1b1e61,(char (*) [2])(local_570 + 8),in_R9);
        std::runtime_error::runtime_error(this_01,(string *)local_4c8._M_local_buf);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::substr((ulong)(local_570 + 8),local_528._M_allocated_capacity + 0x20);
      plVar9 = (long *)std::__cxx11::string::append(local_570 + 8);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar10) {
        local_4b8[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_4b8[0]._8_8_ = plVar9[3];
        local_4c8._M_allocated_capacity = (size_type)local_4b8;
      }
      else {
        local_4b8[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_4c8._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar9;
      }
      local_4c8._8_8_ = plVar9[1];
      *plVar9 = (long)paVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)(local_528._M_allocated_capacity + 0x20),(string *)local_4c8._M_local_buf
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_allocated_capacity != local_4b8) {
        operator_delete((void *)local_4c8._M_allocated_capacity,local_4b8[0]._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_570._12_4_,local_570._8_4_) != &local_558) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_570._12_4_,local_570._8_4_),
                        local_558._M_allocated_capacity + 1);
      }
      util::join((string *)&local_4c8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_528,'_');
      std::__cxx11::string::operator=((string *)&local_268,(string *)local_4c8._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_allocated_capacity != local_4b8) {
        operator_delete((void *)local_4c8._M_allocated_capacity,local_4b8[0]._0_8_ + 1);
      }
      std::__cxx11::string::_M_replace((ulong)local_78,0,local_70,0x1b3a3f);
      std::__cxx11::string::_M_replace((ulong)local_58,0,local_50,0x1b3a42);
      GOESRProduct::getImage((GOESRProduct *)(local_580 + 8),(Handler *)local_468);
      GOESRProduct::getImage((GOESRProduct *)local_580,(Handler *)p1);
      cv::Mat::Mat(local_2e8,&(this->config_).lut);
      Image::generateFalseColor
                ((Image *)local_570,
                 (unique_ptr<Image,_std::default_delete<Image>_> *)(local_580 + 8),
                 (unique_ptr<Image,_std::default_delete<Image>_> *)local_580,local_2e8);
      cv::Mat::~Mat(local_2e8);
      uVar4 = local_580._8_8_;
      local_580._8_8_ = (Mat *)0x0;
      if ((Mat *)uVar4 != (Mat *)0x0) {
        cv::Mat::~Mat((Mat *)uVar4);
        operator_delete((void *)uVar4,0x78);
      }
      uVar4 = local_580._0_8_;
      local_580._0_8_ = (__uniq_ptr_impl<Image,_std::default_delete<Image>_>)0x0;
      if ((_Head_base<0UL,_Image_*,_false>)uVar4 != (_Head_base<0UL,_Image_*,_false>)0x0) {
        cv::Mat::~Mat((Mat *)uVar4);
        operator_delete((void *)uVar4,0x78);
      }
      Image::getRawImage((Image *)&local_4c8);
      pcVar1 = (this->config_).format._M_dataplus._M_p;
      local_508._M_allocated_capacity = (size_type)&local_4f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_508,pcVar1,pcVar1 + (this->config_).format._M_string_length);
      FilenameBuilder::build
                ((string *)(local_570 + 8),(FilenameBuilder *)local_288,&(this->config_).filename,
                 (string *)&local_508);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_allocated_capacity != &local_4f8) {
        operator_delete((void *)local_508._M_allocated_capacity,(ulong)(local_4f8._0_8_ + 1));
      }
      FileWriter::write((this->fileWriter_).
                        super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (int)local_570 + 8,&local_4c8,(size_t)&local_510);
      if ((this->config_).json == true) {
        FileWriter::writeHeader
                  ((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,*(File **)local_468._0_8_,(string *)(local_570 + 8));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_570._12_4_,local_570._8_4_) != &local_558) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_570._12_4_,local_570._8_4_),
                        local_558._M_allocated_capacity + 1);
      }
      cv::Mat::~Mat((Mat *)local_4c8._M_local_buf);
      std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
                ((unique_ptr<Image,_std::default_delete<Image>_> *)local_570);
      std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
                ((unique_ptr<Image,_std::default_delete<Image>_> *)local_580);
      std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
                ((unique_ptr<Image,_std::default_delete<Image>_> *)(local_580 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_528);
      FilenameBuilder::~FilenameBuilder((FilenameBuilder *)local_288);
    }
  }
  else {
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,(key_type *)&local_548);
    std::
    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
    _M_move_assign(&pmVar7->files_,p1);
    _Var3 = (p1->frameStart_).tv_nsec;
    (pmVar7->frameStart_).tv_sec = (p1->frameStart_).tv_sec;
    (pmVar7->frameStart_).tv_nsec = _Var3;
    std::__cxx11::string::operator=((string *)&pmVar7->product_,(string *)&p1->product_);
    std::__cxx11::string::operator=
              ((string *)&(pmVar7->product_).nameLong,(string *)&(p1->product_).nameLong);
    std::__cxx11::string::operator=((string *)&pmVar7->region_,(string *)&p1->region_);
    std::__cxx11::string::operator=
              ((string *)&(pmVar7->region_).nameLong,(string *)&(p1->region_).nameLong);
    std::__cxx11::string::operator=((string *)&pmVar7->channel_,(string *)&p1->channel_);
    std::__cxx11::string::operator=
              ((string *)&(pmVar7->channel_).nameLong,(string *)&(p1->channel_).nameLong);
    std::__cxx11::string::operator=((string *)&pmVar7->satellite_,(string *)&p1->satellite_);
    pmVar7->satelliteID_ = p1->satelliteID_;
    std::__cxx11::string::operator=((string *)&pmVar7->instrument_,(string *)&p1->instrument_);
    std::__cxx11::string::operator=((string *)&pmVar7->imagingMode_,(string *)&p1->imagingMode_);
    std::__cxx11::string::operator=((string *)&pmVar7->resolution_,(string *)&p1->resolution_);
    pmVar7->segmented_ = p1->segmented_;
  }
  GOESRProduct::~GOESRProduct((GOESRProduct *)local_468);
LAB_00181304:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_allocated_capacity != &local_538) {
    operator_delete((void *)local_548._M_allocated_capacity,local_538._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GOESRImageHandler::handleImageForFalseColor(GOESRProduct p1) {
  Timer t;

  const auto key = p1.getRegion().nameShort;
  if (falseColor_.find(key) == falseColor_.end()) {
    falseColor_[key] = std::move(p1);
    return;
  }

  // Move existing product into local scope such that the local
  // one is the only remaining reference to this product.
  auto p0 = std::move(falseColor_[key]);
  falseColor_.erase(key);

  // Verify that observation time is identical.
  if (p0.getFrameStart().tv_sec != p1.getFrameStart().tv_sec) {
    falseColor_[key] = std::move(p1);
    return;
  }

  // If the channels are the same, there has been duplication on the
  // packet stream and we can ignore the latest one.
  if (p0.getChannel().nameShort == p1.getChannel().nameShort) {
    falseColor_[key] = std::move(p0);
    return;
  }

  // Swap if ordering of products doesn't match ordering of channels
  if (p0.getChannel().nameShort != config_.channels.front()) {
    std::swap(p0, p1);
  }

  // Use filename builder of first channel
  auto fb = p0.getFilenameBuilder(config_);

  // Update filename in filename builder to reflect that this is a
  // synthesized image. It would be misleading to use the filename of
  // either one of the input files.
  //
  // For example: in OR_ABI-L2-CMIPF-M3C13_G16_[...] the C13 is
  // replaced by CFC.
  //
  auto parts = split(fb.filename, '_');
  auto pos = parts[1].rfind('C');
  ASSERT(pos != std::string::npos);
  parts[1] = parts[1].substr(0, pos) + "CFC";
  fb.filename = join(parts, '_');

  // Replace channel field in filename builder.
  // The incoming filename builder will have the channel set to one of
  // the two channels used for this false color image.
  fb.channel.nameShort = "FC";
  fb.channel.nameLong = "False Color";

  // Generate false color image.
  auto i0 = p0.getImage(config_);
  auto i1 = p1.getImage(config_);
  auto out = Image::generateFalseColor(i0, i1, config_.lut);
  i0.reset();
  i1.reset();

  auto mat = out->getRawImage();
  overlayMaps(p0, mat);
  auto path = fb.build(config_.filename, config_.format);
  fileWriter_->write(path, mat, &t);
  if (config_.json) {
    fileWriter_->writeHeader(p0.firstFile(), path);
  }
}